

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O3

void OnUpdateGamefield(Gamefield *gamefield)

{
  uint uVar1;
  ulong uVar2;
  uint8_t *__ptr;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  gamefield->simulationStep = gamefield->simulationStep + '\x01';
  uVar3 = gamefield->height;
  if (uVar3 != 0) {
    uVar4 = gamefield->width;
    lVar8 = 0;
    lVar7 = 0;
    uVar6 = 0;
    do {
      uVar1 = 0;
      if (uVar4 != 0) {
        uVar2 = (ulong)uVar4;
        lVar9 = 8;
        uVar5 = 0;
        do {
          if ((&(gamefield->pixels->color).r)[lVar9 + uVar2 * lVar7] != gamefield->simulationStep) {
            switch(*(undefined4 *)((long)gamefield->pixels + lVar9 + -4 + uVar2 * lVar7)) {
            case 0:
              SandStep(gamefield,(IntVec2)(lVar8 + uVar5));
              break;
            case 1:
              WaterStep(gamefield,(IntVec2)(lVar8 + uVar5));
              break;
            case 5:
              SmokeStep(gamefield,(IntVec2)(lVar8 + uVar5));
              break;
            case 6:
              FireStep(gamefield,(IntVec2)(lVar8 + uVar5));
            }
          }
          uVar5 = uVar5 + 1;
          uVar2 = (ulong)gamefield->width;
          lVar9 = lVar9 + 0x14;
        } while (uVar5 < uVar2);
        uVar3 = gamefield->height;
        uVar1 = gamefield->width;
      }
      uVar4 = uVar1;
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x14;
      lVar8 = lVar8 + 0x100000000;
    } while (uVar6 < uVar3);
  }
  __ptr = GetRawColor32Array(gamefield);
  (*glad_glTexImage2D)(0xde1,0,0x1908,gamefield->width,gamefield->height,0,0x1908,0x1401,__ptr);
  free(__ptr);
  return;
}

Assistant:

void OnUpdateGamefield(Gamefield* gamefield) {
    gamefield->simulationStep += 1;
    for (size_t y = 0; y < gamefield->height; y++) {
        for (size_t x = 0; x < gamefield->width; x++) {
            if (gamefield->pixels[y * gamefield->width + x].lastUpdatedFrameNumber == gamefield->simulationStep) continue;
            IntVec2 coords;
            coords.x = x;
            coords.y = y;
            if (gamefield->pixels[y * gamefield->width + x].pixelType == Sand) {
                SandStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Water) {
                WaterStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Smoke) {
                SmokeStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Fire) {
                FireStep(gamefield, coords);
            }
        }
    }

    uint8_t* rawPixelArray = NULL;
    if (rawPixelArray == NULL) {
        rawPixelArray = GetRawColor32Array(gamefield);
    }
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, gamefield->width, gamefield->height, 0, GL_RGBA, GL_UNSIGNED_BYTE, rawPixelArray);
    free(rawPixelArray);
}